

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

Uint32 __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::GetStaticVariableCount
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this,SHADER_TYPE ShaderType)

{
  undefined *puVar1;
  SHADER_TYPE SVar2;
  undefined8 uVar3;
  PipelineResourceSignatureImplType *this_00;
  char (*in_stack_ffffffffffffff68) [3];
  Char *local_78;
  undefined1 local_70 [8];
  string _msg_1;
  undefined1 local_40 [8];
  string _msg;
  SHADER_TYPE ShaderType_local;
  PipelineStateBase<Diligent::EngineGLImplTraits> *this_local;
  
  _msg.field_2._12_4_ = ShaderType;
  CheckPipelineReady(this);
  if ((this->m_UsingImplicitSignature & 1U) == 0) {
    FormatString<char[171]>
              ((string *)local_40,
               (char (*) [171])
               "IPipelineState::GetStaticVariableCount is not allowed for pipelines that use explicit resource signatures. Use IPipelineResourceSignature::GetStaticVariableCount instead."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar3,0);
    }
    std::__cxx11::string::~string((string *)local_40);
    this_local._4_4_ = 0;
  }
  else {
    SVar2 = Diligent::operator&(this->m_ActiveShaderStages,_msg.field_2._12_4_);
    if (SVar2 == SHADER_TYPE_UNKNOWN) {
      local_78 = GetShaderTypeLiteralName(_msg.field_2._12_4_);
      FormatString<char[62],char_const*,char[35],char_const*,char[3]>
                ((string *)local_70,
                 (Diligent *)"Unable to get the number of static variables in shader stage ",
                 (char (*) [62])&local_78,(char **)" as the stage is inactive in PSO \'",
                 (char (*) [35])
                 &(this->
                  super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                  ).m_Desc,(char **)"\'.",in_stack_ffffffffffffff68);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar3 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(1,uVar3,0);
      }
      std::__cxx11::string::~string((string *)local_70);
      this_local._4_4_ = 0;
    }
    else {
      this_00 = GetResourceSignature(this,0);
      this_local._4_4_ =
           PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetStaticVariableCount
                     (&this_00->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                      _msg.field_2._12_4_);
    }
  }
  return this_local._4_4_;
}

Assistant:

GetStaticVariableCount(SHADER_TYPE ShaderType) const override final
    {
        CheckPipelineReady();

        if (!m_UsingImplicitSignature)
        {
            LOG_ERROR_MESSAGE("IPipelineState::GetStaticVariableCount is not allowed for pipelines that use explicit "
                              "resource signatures. Use IPipelineResourceSignature::GetStaticVariableCount instead.");
            return 0;
        }

        if ((m_ActiveShaderStages & ShaderType) == 0)
        {
            LOG_WARNING_MESSAGE("Unable to get the number of static variables in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is inactive in PSO '", this->m_Desc.Name, "'.");
            return 0;
        }

        return this->GetResourceSignature(0)->GetStaticVariableCount(ShaderType);
    }